

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  code *pcVar1;
  Mem *p;
  uint uVar2;
  CollSeq *pCVar3;
  Vdbe *pVVar4;
  HashElem *pHVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  int iVar7;
  byte enc_00;
  void *pvVar8;
  long lVar9;
  uint h;
  uint local_34;
  
  uVar2 = (uint)CONCAT71(in_register_00000011,enc);
  uVar6 = 2;
  if ((uVar2 - 4 & 0xfb) != 0) {
    uVar6 = uVar2;
  }
  if (uVar6 - 4 < 0xfffffffd) {
    iVar7 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1fade,
                "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  }
  else {
    enc_00 = (byte)uVar6;
    pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,0);
    if ((pCVar3 != (CollSeq *)0x0) &&
       (pCVar3->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
      if (db->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(db,5,
                            "unable to delete/modify collation sequence due to active statements");
        return 5;
      }
      for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pNext) {
        pVVar4->field_0x8c = pVVar4->field_0x8c | 8;
      }
      if (uVar6 == (pCVar3->enc & 0xfffffff7)) {
        pHVar5 = findElementWithHash(&db->aCollSeq,zName,&local_34);
        if (pHVar5 == (HashElem *)0x0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = pHVar5->data;
        }
        lVar9 = 0;
        do {
          if (*(u8 *)((long)pvVar8 + lVar9 + 8) == pCVar3->enc) {
            pcVar1 = *(code **)((long)pvVar8 + lVar9 + 0x20);
            if (pcVar1 != (code *)0x0) {
              (*pcVar1)(*(undefined8 *)((long)pvVar8 + lVar9 + 0x10));
            }
            *(undefined8 *)((long)pvVar8 + lVar9 + 0x18) = 0;
          }
          lVar9 = lVar9 + 0x28;
        } while (lVar9 != 0x78);
      }
    }
    pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,1);
    if (pCVar3 == (CollSeq *)0x0) {
      iVar7 = 7;
    }
    else {
      pCVar3->xCmp = xCompare;
      pCVar3->pUser = pCtx;
      pCVar3->xDel = xDel;
      pCVar3->enc = enc_00 | enc & 8;
      db->errCode = 0;
      p = db->pErr;
      iVar7 = 0;
      if (p != (Mem *)0x0) {
        if ((p->flags & 0x2460) == 0) {
          p->flags = 1;
        }
        else {
          vdbeMemClearExternAndSetNull(p);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName, 
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;
  
  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation 
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY, 
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */ 
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK);
  return SQLITE_OK;
}